

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::copy_fromHPresolveToHModel(HModel *this,HPresolve *ptr_model)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (ptr_model->super_HPreData).numCol;
  this->numCol = iVar1;
  iVar2 = (ptr_model->super_HPreData).numRow;
  this->numRow = iVar2;
  this->numTot = iVar2 + iVar1;
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->Astart,&(ptr_model->super_HPreData).Astart);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->Aindex,&(ptr_model->super_HPreData).Aindex);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->Avalue,&(ptr_model->super_HPreData).Avalue);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->colCost,&(ptr_model->super_HPreData).colCost);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->colLower,&(ptr_model->super_HPreData).colLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->colUpper,&(ptr_model->super_HPreData).colUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->rowLower,&(ptr_model->super_HPreData).rowLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->rowUpper,&(ptr_model->super_HPreData).rowUpper);
  return;
}

Assistant:

void HModel::copy_fromHPresolveToHModel(HPresolve* ptr_model) {
  numCol = ptr_model->numCol;
  numRow = ptr_model->numRow;
  numTot = ptr_model->numCol + ptr_model->numRow;
  Astart = ptr_model->Astart;
  Aindex = ptr_model->Aindex;
  Avalue = ptr_model->Avalue;
  colCost = ptr_model->colCost;
  colLower = ptr_model->colLower;
  colUpper = ptr_model->colUpper;
  rowLower = ptr_model->rowLower;
  rowUpper = ptr_model->rowUpper;
}